

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strip_tags(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint in_EAX;
  char *zIn;
  char *zTaglist;
  int nTaglen_00;
  int nLen;
  int nTaglen;
  undefined8 local_28;
  
  local_28 = (ulong)in_EAX;
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9_value_string(pCtx->pRet,"",0);
  }
  else {
    zIn = jx9_value_to_string(*apArg,(int *)&local_28);
    if ((nArg == 1) || ((apArg[1]->iFlags & 1) == 0)) {
      zTaglist = (char *)0x0;
      nTaglen_00 = 0;
    }
    else {
      zTaglist = jx9_value_to_string(apArg[1],(int *)((long)&local_28 + 4));
      nTaglen_00 = local_28._4_4_;
    }
    jx9StripTagsFromString(pCtx,zIn,(int)local_28,zTaglist,nTaglen_00);
  }
  return 0;
}

Assistant:

static int jx9Builtin_strip_tags(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zTaglist = 0;
	const char *zString;
	int nTaglen = 0;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the raw string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nArg > 1 && jx9_value_is_string(apArg[1]) ){
		/* Allowed tag */
		zTaglist = jx9_value_to_string(apArg[1], &nTaglen);		
	}
	/* Process input */
	jx9StripTagsFromString(pCtx, zString, nLen, zTaglist, nTaglen);
	return JX9_OK;
}